

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void TraceLog(int logType,char *text,...)

{
  undefined4 uVar1;
  char in_AL;
  size_t sVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t __n;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [256];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (logTypeLevel <= logType) {
    args[0].reg_save_area = local_d8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x10;
    args[0].fp_offset = 0x30;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    if (traceLog == (TraceLogCallback)0x0) {
      memset(buffer,0,0x100);
      switch(logType) {
      case 1:
        buffer[0] = 'T';
        buffer[1] = 'R';
        buffer[2] = 'A';
        buffer[3] = 'C';
        buffer[4] = 'E';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
        break;
      case 2:
        buffer[0] = 'D';
        buffer[1] = 'E';
        buffer[2] = 'B';
        buffer[3] = 'U';
        buffer[4] = 'G';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
        break;
      case 3:
        builtin_strncpy(buffer,"INFO: ",7);
        uVar1 = buffer._0_4_;
        buffer._0_8_ = CONCAT44(buffer._4_4_,uVar1);
        break;
      case 4:
        builtin_strncpy(buffer,"WARNING: ",10);
        break;
      case 5:
        buffer[0] = 'E';
        buffer[1] = 'R';
        buffer[2] = 'R';
        buffer[3] = 'O';
        buffer[4] = 'R';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
        break;
      case 6:
        buffer[0] = 'F';
        buffer[1] = 'A';
        buffer[2] = 'T';
        buffer[3] = 'A';
        buffer[4] = 'L';
        buffer[5] = ':';
        buffer[6] = ' ';
        buffer[7] = '\0';
      }
      sVar2 = strlen(text);
      sVar3 = strlen(buffer);
      __n = 0xf4;
      if ((uint)sVar2 < 0xf4) {
        __n = sVar2 & 0xffffffff;
      }
      memcpy(buffer + sVar3,text,__n);
      sVar2 = strlen(buffer);
      (buffer + sVar2)[0] = '\n';
      (buffer + sVar2)[1] = '\0';
      vprintf(buffer,args);
      fflush(_stdout);
      if (logType == 6) {
        exit(1);
      }
    }
    else {
      (*traceLog)(logType,text,args);
    }
  }
  return;
}

Assistant:

void TraceLog(int logType, const char *text, ...)
{
#if defined(SUPPORT_TRACELOG)
    // Message has level below current threshold, don't emit
    if (logType < logTypeLevel) return;

    va_list args;
    va_start(args, text);

    if (traceLog)
    {
        traceLog(logType, text, args);
        va_end(args);
        return;
    }

#if defined(PLATFORM_ANDROID)
    switch (logType)
    {
        case LOG_TRACE: __android_log_vprint(ANDROID_LOG_VERBOSE, "raylib", text, args); break;
        case LOG_DEBUG: __android_log_vprint(ANDROID_LOG_DEBUG, "raylib", text, args); break;
        case LOG_INFO: __android_log_vprint(ANDROID_LOG_INFO, "raylib", text, args); break;
        case LOG_WARNING: __android_log_vprint(ANDROID_LOG_WARN, "raylib", text, args); break;
        case LOG_ERROR: __android_log_vprint(ANDROID_LOG_ERROR, "raylib", text, args); break;
        case LOG_FATAL: __android_log_vprint(ANDROID_LOG_FATAL, "raylib", text, args); break;
        default: break;
    }
#else
    char buffer[MAX_TRACELOG_MSG_LENGTH] = { 0 };

    switch (logType)
    {
        case LOG_TRACE: strcpy(buffer, "TRACE: "); break;
        case LOG_DEBUG: strcpy(buffer, "DEBUG: "); break;
        case LOG_INFO: strcpy(buffer, "INFO: "); break;
        case LOG_WARNING: strcpy(buffer, "WARNING: "); break;
        case LOG_ERROR: strcpy(buffer, "ERROR: "); break;
        case LOG_FATAL: strcpy(buffer, "FATAL: "); break;
        default: break;
    }

    unsigned int textSize = (unsigned int)strlen(text);
    memcpy(buffer + strlen(buffer), text, (textSize < (MAX_TRACELOG_MSG_LENGTH - 12))? textSize : (MAX_TRACELOG_MSG_LENGTH - 12));
    strcat(buffer, "\n");
    vprintf(buffer, args);
    fflush(stdout);
#endif

    va_end(args);

    if (logType == LOG_FATAL) exit(EXIT_FAILURE);  // If fatal logging, exit program

#endif  // SUPPORT_TRACELOG
}